

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool bssl::add_outgoing(SSL *ssl,bool is_ccs,Array<unsigned_char> *data)

{
  uint16_t *puVar1;
  DTLS1_STATE *pDVar2;
  SSL_HANDSHAKE *pSVar3;
  Span<const_unsigned_char> in;
  bool bVar4;
  size_t sVar5;
  DTLSOutgoingMessage *pDVar6;
  int reason;
  int line;
  DTLSOutgoingMessage msg;
  DTLSOutgoingMessage local_88;
  DTLSOutgoingMessage local_58;
  
  if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x2) !=
      (undefined1  [1016])0x0) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }
  if (!is_ccs) {
    if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x8) !=
        (undefined1  [1016])0x0) {
      reason = 0x45;
      line = 0x24b;
LAB_00171188:
      ERR_put_error(0x10,0,reason,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,line);
      return false;
    }
    pSVar3 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if ((pSVar3 != (SSL_HANDSHAKE *)0x0) &&
       (in.data_ = data->data_, in.size_ = data->size_,
       bVar4 = SSLTranscript::Update(&pSVar3->transcript,in), !bVar4)) {
      reason = 0x44;
      line = 0x251;
      goto LAB_00171188;
    }
    pDVar2 = ssl->d1;
    puVar1 = &pDVar2->handshake_write_seq;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      *(byte *)pDVar2 = *(byte *)pDVar2 | 8;
    }
  }
  local_88.acked.bytes_.data_ = (uchar *)0x0;
  local_88.acked.bytes_.size_ = 0;
  local_88.acked.first_unmarked_byte_ = 0;
  local_88.data.data_ = (uchar *)0x0;
  local_88.data.size_._0_7_ = 0;
  local_88.data.size_._7_1_ = 0;
  local_88.epoch = 0;
  local_88.is_ccs = false;
  OPENSSL_free((void *)0x0);
  local_88.data.data_ = data->data_;
  local_88.data.size_._0_7_ = (undefined7)data->size_;
  local_88.data.size_._7_1_ = (undefined1)(data->size_ >> 0x38);
  data->data_ = (uchar *)0x0;
  data->size_ = 0;
  local_88.epoch = *(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6);
  local_88.is_ccs = is_ccs;
  if (!is_ccs) {
    sVar5 = DTLSOutgoingMessage::msg_len(&local_88);
    bVar4 = DTLSMessageBitmap::Init(&local_88.acked,sVar5 + (sVar5 == 0));
    if (!bVar4) {
      bVar4 = false;
      goto LAB_00171152;
    }
  }
  pDVar2 = ssl->d1;
  local_58.data.data_ = (uchar *)0x0;
  local_58.data.size_ = 0;
  OPENSSL_free((void *)0x0);
  local_58.data.size_ = CONCAT17(local_88.data.size_._7_1_,(undefined7)local_88.data.size_);
  local_58.data.data_ = local_88.data.data_;
  local_88.data.data_ = (uchar *)0x0;
  local_88.data.size_._0_7_ = 0;
  local_88.data.size_._7_1_ = 0;
  local_58.epoch = local_88.epoch;
  local_58.is_ccs = local_88.is_ccs;
  local_58.acked.bytes_.data_ = (uchar *)0x0;
  local_58.acked.bytes_.size_ = 0;
  OPENSSL_free((void *)0x0);
  local_58.acked.bytes_.data_ = local_88.acked.bytes_.data_;
  local_58.acked.bytes_.size_ = local_88.acked.bytes_.size_;
  local_88.acked.bytes_.data_ = (uchar *)0x0;
  local_88.acked.bytes_.size_ = 0;
  local_58.acked.first_unmarked_byte_ = local_88.acked.first_unmarked_byte_;
  pDVar6 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::TryPushBack
                     (&pDVar2->outgoing_messages,&local_58);
  OPENSSL_free(local_58.acked.bytes_.data_);
  local_58.acked.bytes_.data_ = (uchar *)0x0;
  local_58.acked.bytes_.size_ = 0;
  OPENSSL_free(local_58.data.data_);
  local_58.data.data_ = (uchar *)0x0;
  local_58.data.size_ = 0;
  bVar4 = true;
  if (pDVar6 == (DTLSOutgoingMessage *)0x0) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x26c,"bool bssl::add_outgoing(SSL *, bool, Array<uint8_t>)");
  }
LAB_00171152:
  OPENSSL_free(local_88.acked.bytes_.data_);
  local_88.acked.bytes_.data_ = (uchar *)0x0;
  local_88.acked.bytes_.size_ = 0;
  OPENSSL_free(local_88.data.data_);
  return bVar4;
}

Assistant:

static bool add_outgoing(SSL *ssl, bool is_ccs, Array<uint8_t> data) {
  if (ssl->d1->outgoing_messages_complete) {
    // If we've begun writing a new flight, we received the peer flight. Discard
    // the timer and the our flight.
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!is_ccs) {
    if (ssl->d1->handshake_write_overflow) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return false;
    }
    // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript
    // on hs.
    if (ssl->s3->hs != NULL && !ssl->s3->hs->transcript.Update(data)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    ssl->d1->handshake_write_seq++;
    if (ssl->d1->handshake_write_seq == 0) {
      ssl->d1->handshake_write_overflow = true;
    }
  }

  DTLSOutgoingMessage msg;
  msg.data = std::move(data);
  msg.epoch = ssl->d1->write_epoch.epoch();
  msg.is_ccs = is_ccs;
  // Zero-length messages need 1 bit to track whether the peer has received the
  // message header. (Normally the message header is implicitly received when
  // any fragment of the message is received at all.)
  if (!is_ccs && !msg.acked.Init(std::max(msg.msg_len(), size_t{1}))) {
    return false;
  }

  // This should not fail if |SSL_MAX_HANDSHAKE_FLIGHT| was sized correctly.
  //
  // TODO(crbug.com/42290594): This can currently fail in DTLS 1.3. The caller
  // can configure how many tickets to send, up to kMaxTickets. Additionally, if
  // we send 0.5-RTT tickets in 0-RTT, we may even have tickets queued up with
  // the server flight.
  if (!ssl->d1->outgoing_messages.TryPushBack(std::move(msg))) {
    assert(false);
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}